

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void FTransformPass2_SSE2(__m128i *v01,__m128i *v32,int16_t *out)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  sVar1 = (short)(*v01)[0];
  sVar2 = *(short *)((long)*v01 + 2);
  sVar3 = *(short *)((long)*v01 + 4);
  sVar4 = *(short *)((long)*v01 + 6);
  sVar9 = (short)(*v01)[1];
  sVar10 = *(short *)((long)*v01 + 10);
  sVar11 = *(short *)((long)*v01 + 0xc);
  sVar12 = *(short *)((long)*v01 + 0xe);
  sVar5 = (short)(*v32)[0];
  sVar6 = *(short *)((long)*v32 + 2);
  sVar7 = *(short *)((long)*v32 + 4);
  sVar8 = *(short *)((long)*v32 + 6);
  sVar13 = (short)(*v32)[1];
  sVar14 = *(short *)((long)*v32 + 10);
  sVar15 = *(short *)((long)*v32 + 0xc);
  sVar16 = *(short *)((long)*v32 + 0xe);
  auVar21._0_4_ = CONCAT22(sVar2 - sVar6,sVar1 - sVar5);
  auVar17._0_8_ = CONCAT26(sVar4 - sVar8,CONCAT24(sVar3 - sVar7,auVar21._0_4_));
  auVar17._8_2_ = sVar9 - sVar13;
  auVar17._10_2_ = sVar10 - sVar14;
  auVar19._12_2_ = sVar11 - sVar15;
  auVar19._0_12_ = auVar17;
  auVar19._14_2_ = sVar12 - sVar16;
  auVar21._12_4_ = auVar19._12_4_;
  auVar21._4_4_ = auVar17._8_4_;
  auVar21._8_4_ = (int)((ulong)auVar17._0_8_ >> 0x20);
  auVar18 = pshuflw(auVar21,auVar21,0x72);
  auVar18 = pshufhw(auVar18,auVar18,0x72);
  auVar19 = pmaddwd(_DAT_001abc20,auVar18);
  auVar18 = pmaddwd(auVar18,_DAT_001abc30);
  auVar20._0_4_ = auVar19._0_4_ + 0x12ee0 >> 0x10;
  auVar20._4_4_ = auVar19._4_4_ + 0x12ee0 >> 0x10;
  auVar20._8_4_ = auVar19._8_4_ + 0x12ee0 >> 0x10;
  auVar20._12_4_ = auVar19._12_4_ + 0x12ee0 >> 0x10;
  auVar23._0_4_ = auVar18._0_4_ + 51000 >> 0x10;
  auVar23._4_4_ = auVar18._4_4_ + 51000 >> 0x10;
  auVar23._8_4_ = auVar18._8_4_ + 51000 >> 0x10;
  auVar23._12_4_ = auVar18._12_4_ + 51000 >> 0x10;
  auVar21 = packssdw(auVar20,auVar20);
  auVar19 = packssdw(auVar23,auVar23);
  sVar13 = sVar13 + sVar9;
  sVar14 = sVar14 + sVar10;
  sVar15 = sVar15 + sVar11;
  sVar16 = sVar16 + sVar12;
  sVar9 = sVar5 + sVar1 + 7;
  sVar10 = sVar6 + sVar2 + 7;
  sVar11 = sVar7 + sVar3 + 7;
  sVar12 = sVar8 + sVar4 + 7;
  auVar22._0_2_ = sVar9 + sVar13;
  auVar22._2_2_ = sVar10 + sVar14;
  auVar22._4_2_ = sVar11 + sVar15;
  auVar22._6_2_ = sVar12 + sVar16;
  auVar22._8_2_ = sVar13 + 7 + sVar13;
  auVar22._10_2_ = sVar14 + 7 + sVar14;
  auVar22._12_2_ = sVar15 + 7 + sVar15;
  auVar22._14_2_ = sVar16 + 7 + sVar16;
  auVar18._0_2_ = sVar9 - sVar13;
  auVar18._2_2_ = sVar10 - sVar14;
  auVar18._4_2_ = sVar11 - sVar15;
  auVar18._6_2_ = sVar12 - sVar16;
  auVar18._8_2_ = (sVar13 + 7) - sVar13;
  auVar18._10_2_ = (sVar14 + 7) - sVar14;
  auVar18._12_2_ = (sVar15 + 7) - sVar15;
  auVar18._14_2_ = (sVar16 + 7) - sVar16;
  auVar23 = psraw(auVar22,4);
  auVar18 = psraw(auVar18,4);
  *(long *)out = auVar23._0_8_;
  *(ulong *)(out + 4) =
       CONCAT26(auVar21._6_2_ - (ushort)(sVar4 == sVar8),
                CONCAT24(auVar21._4_2_ - (ushort)(sVar3 == sVar7),
                         CONCAT22(auVar21._2_2_ - (ushort)(sVar2 == sVar6),
                                  auVar21._0_2_ - (ushort)(sVar1 == sVar5))));
  *(long *)(out + 8) = auVar18._0_8_;
  *(long *)(out + 0xc) = auVar19._0_8_;
  return;
}

Assistant:

static void FTransformPass2_SSE2(const __m128i* const v01,
                                 const __m128i* const v32,
                                 int16_t* WEBP_RESTRICT out) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i seven = _mm_set1_epi16(7);
  const __m128i k5352_2217 = _mm_set_epi16(5352,  2217, 5352,  2217,
                                           5352,  2217, 5352,  2217);
  const __m128i k2217_5352 = _mm_set_epi16(2217, -5352, 2217, -5352,
                                           2217, -5352, 2217, -5352);
  const __m128i k12000_plus_one = _mm_set1_epi32(12000 + (1 << 16));
  const __m128i k51000 = _mm_set1_epi32(51000);

  // Same operations are done on the (0,3) and (1,2) pairs.
  // a3 = v0 - v3
  // a2 = v1 - v2
  const __m128i a32 = _mm_sub_epi16(*v01, *v32);
  const __m128i a22 = _mm_unpackhi_epi64(a32, a32);

  const __m128i b23 = _mm_unpacklo_epi16(a22, a32);
  const __m128i c1 = _mm_madd_epi16(b23, k5352_2217);
  const __m128i c3 = _mm_madd_epi16(b23, k2217_5352);
  const __m128i d1 = _mm_add_epi32(c1, k12000_plus_one);
  const __m128i d3 = _mm_add_epi32(c3, k51000);
  const __m128i e1 = _mm_srai_epi32(d1, 16);
  const __m128i e3 = _mm_srai_epi32(d3, 16);
  // f1 = ((b3 * 5352 + b2 * 2217 + 12000) >> 16)
  // f3 = ((b3 * 2217 - b2 * 5352 + 51000) >> 16)
  const __m128i f1 = _mm_packs_epi32(e1, e1);
  const __m128i f3 = _mm_packs_epi32(e3, e3);
  // g1 = f1 + (a3 != 0);
  // The compare will return (0xffff, 0) for (==0, !=0). To turn that into the
  // desired (0, 1), we add one earlier through k12000_plus_one.
  // -> g1 = f1 + 1 - (a3 == 0)
  const __m128i g1 = _mm_add_epi16(f1, _mm_cmpeq_epi16(a32, zero));

  // a0 = v0 + v3
  // a1 = v1 + v2
  const __m128i a01 = _mm_add_epi16(*v01, *v32);
  const __m128i a01_plus_7 = _mm_add_epi16(a01, seven);
  const __m128i a11 = _mm_unpackhi_epi64(a01, a01);
  const __m128i c0 = _mm_add_epi16(a01_plus_7, a11);
  const __m128i c2 = _mm_sub_epi16(a01_plus_7, a11);
  // d0 = (a0 + a1 + 7) >> 4;
  // d2 = (a0 - a1 + 7) >> 4;
  const __m128i d0 = _mm_srai_epi16(c0, 4);
  const __m128i d2 = _mm_srai_epi16(c2, 4);

  const __m128i d0_g1 = _mm_unpacklo_epi64(d0, g1);
  const __m128i d2_f3 = _mm_unpacklo_epi64(d2, f3);
  _mm_storeu_si128((__m128i*)&out[0], d0_g1);
  _mm_storeu_si128((__m128i*)&out[8], d2_f3);
}